

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiKeyData * ImGui::GetKeyData(ImGuiKey key)

{
  int iVar1;
  
  if ((uint)key < 0x285) {
    if (((uint)key < 0x200) && (iVar1 = (GImGui->IO).KeyMap[(uint)key], iVar1 != -1)) {
      key = iVar1;
    }
    return (GImGui->IO).KeysData + key;
  }
  __assert_fail("key >= ImGuiKey_LegacyNativeKey_BEGIN && key < ImGuiKey_NamedKey_END",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                ,0x1fc9,"ImGuiKeyData *ImGui::GetKeyData(ImGuiKey)");
}

Assistant:

ImGuiKeyData* ImGui::GetKeyData(ImGuiKey key)
{
    ImGuiContext& g = *GImGui;
    int index;
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT(key >= ImGuiKey_LegacyNativeKey_BEGIN && key < ImGuiKey_NamedKey_END);
    if (IsLegacyKey(key))
        index = (g.IO.KeyMap[key] != -1) ? g.IO.KeyMap[key] : key; // Remap native->imgui or imgui->native
    else
        index = key;
#else
    IM_ASSERT(IsNamedKey(key) && "Support for user key indices was dropped in favor of ImGuiKey. Please update backend & user code.");
    index = key - ImGuiKey_NamedKey_BEGIN;
#endif
    return &g.IO.KeysData[index];
}